

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void AtomicHash::print(atomic<unsigned_long> *hash,ostream *os)

{
  __int_type h;
  
  h = (hash->super___atomic_base<unsigned_long>)._M_i;
  outputHex((ostream *)&std::cout,(char *)&h,8);
  return;
}

Assistant:

static void print(std::atomic<uint64_t>& hash, std::ostream& os) {
		auto h = hash.load();
		outputHex(std::cout, (char*)&h, sizeof(h));
	}